

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_finishset(lua_State *L,TValue *t,TValue *key,StkId val,TValue *slot)

{
  ushort uVar1;
  Table *events;
  GCObject *pGVar2;
  TValue *f;
  Table *t_00;
  char *pcVar3;
  int iVar4;
  
  iVar4 = 2000;
  do {
    if (slot == (TValue *)0x0) {
      f = luaT_gettmbyobj(L,t,TM_NEWINDEX);
      uVar1 = f->tt_;
      if (uVar1 == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    else {
      if (t->tt_ != 0x8005) {
        pcVar3 = "((((t))->tt_) == (((5) | (1 << 15))))";
LAB_0013e96d:
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x104,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      t_00 = (Table *)(t->value_).gc;
      if (t_00->tt != '\x05') {
        pcVar3 = "(((t)->value_).gc)->tt == 5";
        goto LAB_0013e96d;
      }
      if (slot->tt_ != 0) {
        __assert_fail("((((slot))->tt_) == (0))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x105,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      events = t_00->metatable;
      if (((events == (Table *)0x0) || ((events->flags & 2) != 0)) ||
         (f = luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1]), f == (TValue *)0x0)) {
        if (slot == &luaO_nilobject_) {
          slot = luaH_newkey(L,t_00,key);
        }
        pGVar2 = (val->value_).gc;
        (slot->value_).gc = pGVar2;
        uVar1 = val->tt_;
        slot->tt_ = uVar1;
        if (-1 < (short)uVar1) {
          t_00->flags = '\0';
          return;
        }
        if (((uVar1 & 0x7f) != (ushort)pGVar2->tt) ||
           ((L != (lua_State *)0x0 && ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x10b,
                        "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                       );
        }
        t_00->flags = '\0';
        if (9 < (t_00->tt & 0xe)) {
          __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x10d,
                        "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                       );
        }
        if ((t_00->marked & 0x20) == 0) {
          return;
        }
        if ((((val->value_).gc)->marked & 0x18) == 0) {
          return;
        }
        goto LAB_0013e93b;
      }
      uVar1 = f->tt_;
    }
    if ((uVar1 & 0xf) == 5) {
      if (uVar1 != 0x8005) {
        pcVar3 = "((((t))->tt_) == (((5) | (1 << 15))))";
LAB_0013e9b4:
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x11c,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      if (((Table *)(f->value_).gc)->tt != '\x05') {
        pcVar3 = "(((t)->value_).gc)->tt == 5";
        goto LAB_0013e9b4;
      }
      slot = luaH_get((Table *)(f->value_).gc,key);
      if (slot->tt_ != 0) {
        pGVar2 = (val->value_).gc;
        (slot->value_).gc = pGVar2;
        uVar1 = val->tt_;
        slot->tt_ = uVar1;
        if (-1 < (short)uVar1) {
          return;
        }
        if (((uVar1 & 0x7f) == (ushort)pGVar2->tt) &&
           ((L == (lua_State *)0x0 || ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))) {
          if ((short)f->tt_ < 0) {
            t_00 = (Table *)(f->value_).gc;
            if ((t_00->marked & 0x20) == 0) {
              return;
            }
            if ((((val->value_).gc)->marked & 0x18) == 0) {
              return;
            }
LAB_0013e93b:
            luaC_barrierback_(L,(GCObject *)t_00);
            return;
          }
          pcVar3 = "(((t)->tt_) & (1 << 15))";
        }
        else {
          pcVar3 = "0";
        }
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x11d,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
    }
    else {
      if ((uVar1 & 0xf) == 6) {
        luaT_callTM(L,f,t,key,val,0);
        return;
      }
      slot = (TValue *)0x0;
    }
    iVar4 = iVar4 + -1;
    t = f;
    if (iVar4 == 0) {
      luaG_runerror(L,"\'__newindex\' chain too long; possible loop");
    }
  } while( true );
}

Assistant:

void luaV_finishset (lua_State *L, const TValue *t, TValue *key,
                     StkId val, const TValue *slot) {
  int loop;  /* counter to avoid infinite loops */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;  /* '__newindex' metamethod */
    if (slot != NULL) {  /* is 't' a table? */
      Table *h = hvalue(t);  /* save 't' table */
      lua_assert(ttisnil(slot));  /* old value must be nil */
      tm = fasttm(L, h->metatable, TM_NEWINDEX);  /* get metamethod */
      if (tm == NULL) {  /* no metamethod? */
        if (slot == luaO_nilobject)  /* no previous entry? */
          slot = luaH_newkey(L, h, key);  /* create one */
        /* no metamethod and (now) there is an entry with given key */
        setobj2t(L, cast(TValue *, slot), val);  /* set its new value */
        invalidateTMcache(h);
        luaC_barrierback(L, obj2gco(h), val);
        return;
      }
      /* else will try the metamethod */
    }
    else {  /* not a table; check metamethod */
      if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
        luaG_typeerror(L, t, "index");
    }
    /* try the metamethod */
    if (ttisfunction(tm)) {
      luaT_callTM(L, tm, t, key, val, 0);
      return;
    }
    t = tm;  /* else repeat assignment over 'tm' */
    if (luaV_fastget(L, t, key, slot, luaH_get)) {
      luaV_finishfastset(L, t, slot, val);
      return;  /* done */
    }
    /* else 'return luaV_finishset(L, t, key, val, slot)' (loop) */
  }
  luaG_runerror(L, "'__newindex' chain too long; possible loop");
}